

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

void FT_Library_Version(FT_Library library,FT_Int *amajor,FT_Int *aminor,FT_Int *apatch)

{
  FT_Int local_34;
  FT_Int local_30;
  FT_Int patch;
  FT_Int minor;
  FT_Int major;
  FT_Int *apatch_local;
  FT_Int *aminor_local;
  FT_Int *amajor_local;
  FT_Library library_local;
  
  patch = 0;
  local_30 = 0;
  local_34 = 0;
  if (library != (FT_Library)0x0) {
    patch = library->version_major;
    local_30 = library->version_minor;
    local_34 = library->version_patch;
  }
  if (amajor != (FT_Int *)0x0) {
    *amajor = patch;
  }
  if (aminor != (FT_Int *)0x0) {
    *aminor = local_30;
  }
  if (apatch != (FT_Int *)0x0) {
    *apatch = local_34;
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_Library_Version( FT_Library   library,
                      FT_Int      *amajor,
                      FT_Int      *aminor,
                      FT_Int      *apatch )
  {
    FT_Int  major = 0;
    FT_Int  minor = 0;
    FT_Int  patch = 0;


    if ( library )
    {
      major = library->version_major;
      minor = library->version_minor;
      patch = library->version_patch;
    }

    if ( amajor )
      *amajor = major;

    if ( aminor )
      *aminor = minor;

    if ( apatch )
      *apatch = patch;
  }